

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wait.cpp
# Opt level: O0

DWORD WaitForSingleObject(HANDLE hHandle,DWORD dwMilliseconds)

{
  DWORD DVar1;
  CPalThread *pThread_00;
  CPalThread *pThread;
  DWORD dwRet;
  DWORD dwMilliseconds_local;
  HANDLE hHandle_local;
  
  _dwRet = hHandle;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  pThread_00 = CorUnix::InternalGetCurrentThread();
  DVar1 = CorUnix::InternalWaitForMultipleObjectsEx
                    (pThread_00,1,(HANDLE *)&dwRet,0,dwMilliseconds,0);
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return DVar1;
}

Assistant:

DWORD
PALAPI
WaitForSingleObject(IN HANDLE hHandle,
                    IN DWORD dwMilliseconds)
{
    DWORD dwRet;

    PERF_ENTRY(WaitForSingleObject);
    ENTRY("WaitForSingleObject(hHandle=%p, dwMilliseconds=%u)\n",
          hHandle, dwMilliseconds);

    CPalThread * pThread = InternalGetCurrentThread();

    dwRet = InternalWaitForMultipleObjectsEx(pThread, 1, &hHandle, FALSE,
                                             dwMilliseconds, FALSE);

    LOGEXIT("WaitForSingleObject returns DWORD %u\n", dwRet);
    PERF_EXIT(WaitForSingleObject);
    return dwRet;
}